

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-utils.h
# Opt level: O2

void wasm::OptUtils::replaceFunctions
               (PassRunner *runner,Module *module,
               map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *replacements)

{
  pointer puVar1;
  Export *pEVar2;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar3;
  undefined1 local_170 [8];
  FunctionRefReplacer replacer;
  anon_class_8_1_3cc6d29f local_28;
  anon_class_8_1_3cc6d29f maybeReplace;
  
  replacer.maybeReplace._M_invoker = (_Invoker_type)replacements;
  local_28.replacements = replacements;
  FunctionRefReplacer::FunctionRefReplacer
            ((FunctionRefReplacer *)local_170,(MaybeReplace *)&replacer.maybeReplace._M_invoker);
  std::_Function_base::~_Function_base((_Function_base *)&replacer.maybeReplace._M_invoker);
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::run((WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
         *)local_170,runner,module);
  WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
  ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::OptUtils::FunctionRefReplacer,_wasm::Visitor<wasm::OptUtils::FunctionRefReplacer,_void>_>_>
                     *)local_170,runner,module);
  if ((module->start).super_IString.str._M_str != (char *)0x0) {
    replaceFunctions::anon_class_8_1_3cc6d29f::operator()(&local_28,&module->start);
  }
  puVar1 = (module->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (module->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pEVar2 = (puVar3->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar2->kind == Function) {
      replaceFunctions::anon_class_8_1_3cc6d29f::operator()(&local_28,&pEVar2->value);
    }
  }
  FunctionRefReplacer::~FunctionRefReplacer((FunctionRefReplacer *)local_170);
  return;
}

Assistant:

inline void replaceFunctions(PassRunner* runner,
                             Module& module,
                             const std::map<Name, Name>& replacements) {
  auto maybeReplace = [&](Name& name) {
    auto iter = replacements.find(name);
    if (iter != replacements.end()) {
      name = iter->second;
    }
  };
  // replace direct calls in code both functions and module elements
  FunctionRefReplacer replacer(maybeReplace);
  replacer.run(runner, &module);
  replacer.runOnModuleCode(runner, &module);

  // replace in start
  if (module.start.is()) {
    maybeReplace(module.start);
  }
  // replace in exports
  for (auto& exp : module.exports) {
    if (exp->kind == ExternalKind::Function) {
      maybeReplace(exp->value);
    }
  }
}